

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O1

double __thiscall duckdb::BoundLimitNode::GetConstantPercentage(BoundLimitNode *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->type == CONSTANT_PERCENTAGE) {
    return this->constant_percentage;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "BoundLimitNode::GetConstantPercentage called but limit is not a constant percentage",
             "");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

double BoundLimitNode::GetConstantPercentage() const {
	if (Type() != LimitNodeType::CONSTANT_PERCENTAGE) {
		throw InternalException("BoundLimitNode::GetConstantPercentage called but limit is not a constant percentage");
	}
	return constant_percentage;
}